

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O0

uint * __thiscall
CAPSFile::ExtractDensity
          (CAPSFile *this,uchar *buffer,int density_buf_size,uint ctype,uint cyl,uint head)

{
  byte bVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  char local_f8 [8];
  char buff [128];
  uint local_6c;
  int i;
  int nbDens;
  uint data;
  uint uStack_58;
  uchar cb0;
  int ofs;
  int size;
  uint offset_source;
  uint *mem;
  uint *buf;
  uint hcrc;
  uint ccrc;
  uint csize;
  uint ucrc;
  uint usize;
  uint head_local;
  uint cyl_local;
  uint ctype_local;
  int density_buf_size_local;
  uchar *buffer_local;
  CAPSFile *this_local;
  
  uVar3 = ExtractInt(buffer + 4);
  ExtractInt(buffer + 8);
  ExtractInt(buffer + 0xc);
  ExtractInt(buffer + 0x10);
  ExtractInt(buffer + 0x14);
  auVar2 = ZEXT416(uVar3 >> 2) * ZEXT816(4);
  uVar4 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  puVar5 = (uint *)operator_new__(uVar4);
  _size = puVar5 + (uVar3 >> 2);
  ofs = density_buf_size;
LAB_001c253b:
  do {
    if (_size <= puVar5) {
      if (cyl == 0x12) {
        for (local_6c = 0; (int)local_6c < (int)(uVar3 >> 2); local_6c = local_6c + 1) {
          if ((0x10 < puVar5[(int)local_6c]) || (puVar5[(int)local_6c] < 0xd)) {
            sprintf(local_f8," index = %i - Valeur = %2.2X ",(ulong)local_6c,
                    (ulong)puVar5[(int)local_6c]);
          }
        }
      }
      return puVar5;
    }
    data = 0;
    uVar6 = ofs - 1;
    bVar1 = buffer[uVar6];
    switch(bVar1 & 3) {
    case 0:
      if ((bVar1 & 8) == 0) {
        uStack_58 = ((int)(uint)bVar1 >> 4) + 1;
        ofs = uVar6;
      }
      else {
        uStack_58 = (bVar1 & 0xf0) << 4 | (uint)buffer[ofs - 2U];
        ofs = ofs - 2U;
      }
      if ((bVar1 & 4) == 0) {
        while (uVar6 = uStack_58 - 1, bVar9 = uStack_58 != 0, uStack_58 = uVar6, bVar9) {
          ofs = ofs - 1;
          _size[-1] = (uint)buffer[(uint)ofs];
          _size = _size + -1;
        }
      }
      else {
        while (uVar6 = uStack_58 - 1, bVar9 = uStack_58 != 0, uStack_58 = uVar6, bVar9) {
          uVar6 = ofs - 1;
          uVar7 = ofs - 2;
          uVar8 = ofs - 3;
          ofs = ofs - 4;
          _size[-1] = CONCAT31(CONCAT21(CONCAT11(buffer[uVar6],buffer[uVar7]),buffer[uVar8]),
                               buffer[(uint)ofs]);
          _size = _size + -1;
        }
      }
      goto LAB_001c253b;
    case 1:
      uStack_58 = ((int)(uint)bVar1 >> 2) + 1;
      data = buffer[ofs - 2U] + 1;
      uVar6 = ofs - 2U;
      break;
    case 2:
      uStack_58 = ((int)(uint)bVar1 >> 2) + 1;
      data = (uint)CONCAT11(buffer[ofs - 2],buffer[ofs - 3U]);
      uVar6 = ofs - 3U;
      break;
    case 3:
      uStack_58 = (bVar1 & 0xfc) << 6 | (uint)buffer[ofs - 2];
      data = (uint)CONCAT11(buffer[ofs - 3],buffer[ofs - 4U]);
      uVar6 = ofs - 4U;
    }
    while (ofs = uVar6, uVar6 = uStack_58 - 1, bVar9 = uStack_58 != 0, uStack_58 = uVar6, bVar9) {
      _size = _size + -1;
      *_size = _size[(int)data];
      uVar6 = ofs;
    }
  } while( true );
}

Assistant:

unsigned int* CAPSFile::ExtractDensity(unsigned char* buffer, int density_buf_size, DWORD ctype, DWORD cyl, DWORD head)
{
   unsigned int usize = ExtractInt(&buffer[4]);
   unsigned int ucrc = ExtractInt(&buffer[8]);; // CRC on uncompressed data
   unsigned int csize = ExtractInt(&buffer[12]);; // compressed size in bytes
   unsigned int ccrc = ExtractInt(&buffer[16]);; // CRC on compressed data
   unsigned int hcrc = ExtractInt(&buffer[20]);; // CRC on header calculated as hcrc=0

   // density
   unsigned int* buf = new unsigned int[usize >> 2];

   // Ptr to end of buffer
   unsigned int* mem = &buf[usize >> 2];
   unsigned int offset_source = density_buf_size;

   // Decode data :
   while (mem > buf)
   {
      int size, ofs = 0;
      unsigned char cb0 = buffer[--offset_source];

      switch (cb0 & 0x03)
      {
      case 0x0: // data block
         // 14 or 4 bit size
         if (cb0 & 0x8)
         {
            size = ((cb0 << 4) & 0xF00) | (buffer[--offset_source]);
         }
         else
         {
            size = (cb0 >> 4) + 1;
         }
         if (cb0 & 0x4)
         {
            // 4 byte per value
            while (size--)
            {
               unsigned int data;
               data = buffer[--offset_source];
               data = (data << 8) | buffer[--offset_source];
               data = (data << 8) | buffer[--offset_source];
               data = (data << 8) | buffer[--offset_source];
               *--mem = data;
            }
         }
         else
         {
            while (size--)
            {
               *--mem = buffer[--offset_source];
            }
         }
         continue;

      case 0x1: // copy block, 8bit offset, 6 bit size
         size = (cb0 >> 2) + 1;
         ofs = buffer[--offset_source] + 1;
         break;
      case 0x2: // copy block, 16 bit offset, 6 bit size
         size = (cb0 >> 2) + 1;
         ofs = buffer[--offset_source];
         ofs = (ofs << 8) | buffer[--offset_source];
         break;
      case 0x3: // Copy block, 16 bit offset, 14 bit size
         size = ((cb0 << 6) & 0x3F00) | buffer[--offset_source];
         ofs = buffer[--offset_source];
         ofs = (ofs << 8) | buffer[--offset_source];
         break;
      }

      while (size--)
      {
         mem--;
         *mem = mem[ofs];
      }
   }


   if (cyl == 0x12)
   {
      int nbDens = (usize >> 2);
      for (int i = 0; i < nbDens; i++)
      {
         if (buf[i] >= 0x11 || buf[i] <= 0x0C)
         {
            char buff[128];
            sprintf(buff, " index = %i - Valeur = %2.2X ", i, buf[i]);
            OutputDebugString (buff);
         }
      }
   }

   return buf;
}